

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O2

filepos_t __thiscall
libebml::EbmlElement::Render
          (EbmlElement *this,IOCallback *output,bool bWithDefault,bool bKeepPosition,
          bool bForceRender)

{
  int iVar1;
  filepos_t fVar2;
  undefined4 extraout_var;
  
  if (this->bValueIsSet == false) {
    if ((!bWithDefault) || (this->DefaultIsSet == false)) {
      __assert_fail("bValueIsSet || (bWithDefault && DefaultISset())",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlElement.cpp"
                    ,0x259,"filepos_t libebml::EbmlElement::Render(IOCallback &, bool, bool, bool)")
      ;
    }
  }
  else if ((!bWithDefault) && (iVar1 = (*this->_vptr_EbmlElement[0xf])(this), (char)iVar1 != '\0'))
  {
    return 0;
  }
  fVar2 = RenderHead(this,output,bForceRender,bWithDefault,bKeepPosition);
  iVar1 = (*this->_vptr_EbmlElement[0x11])(this,output,bForceRender,bWithDefault);
  return CONCAT44(extraout_var,iVar1) + fVar2;
}

Assistant:

filepos_t EbmlElement::Render(IOCallback & output, bool bWithDefault, bool bKeepPosition, bool bForceRender)
{
  assert(bValueIsSet || (bWithDefault && DefaultISset())); // an element is been rendered without a value set !!!
  // it may be a mandatory element without a default value
  if (!bWithDefault && IsDefaultValue()) {
    return 0;
  }
#if defined(LIBEBML_DEBUG)
  uint64 SupposedSize = UpdateSize(bWithDefault, bForceRender);
#endif // LIBEBML_DEBUG
  filepos_t result = RenderHead(output, bForceRender, bWithDefault, bKeepPosition);
  uint64 WrittenSize = RenderData(output, bForceRender, bWithDefault);
#if defined(LIBEBML_DEBUG)
  if (static_cast<int64>(SupposedSize) != (0-1))
    assert(WrittenSize == SupposedSize);
#endif // LIBEBML_DEBUG
  result += WrittenSize;
  return result;
}